

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

DUMB_IT_SIGRENDERER *
dup_sigrenderer(DUMB_IT_SIGRENDERER *src,int n_channels,IT_CALLBACKS *callbacks)

{
  IT_CHANNEL *srcchannel;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  IT_ENTRY *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  DUMB_IT_SIGRENDERER *pDVar8;
  IT_PLAYING *pIVar9;
  void *pvVar10;
  long lVar11;
  IT_CHANNEL *dstchannel;
  
  if ((src != (DUMB_IT_SIGRENDERER *)0x0) &&
     (pDVar8 = (DUMB_IT_SIGRENDERER *)malloc(0x2e98), pDVar8 != (DUMB_IT_SIGRENDERER *)0x0)) {
    pDVar8->free_playing = (IT_PLAYING *)0x0;
    pDVar8->sigdata = src->sigdata;
    pDVar8->n_channels = n_channels;
    pDVar8->resampling_quality = src->resampling_quality;
    pDVar8->globalvolume = src->globalvolume;
    pDVar8->globalvolslide = src->globalvolslide;
    pDVar8->tempo = src->tempo;
    pDVar8->temposlide = src->temposlide;
    dstchannel = pDVar8->channel;
    srcchannel = src->channel;
    lVar11 = 0;
    do {
      *(undefined4 *)(dstchannel->arpeggio_offsets + lVar11 + -0x30) =
           *(undefined4 *)(srcchannel->arpeggio_offsets + lVar11 + -0x30);
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + -0x2c) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + -0x2c);
      pDVar8->channel[0].arpeggio_offsets[lVar11 + -0x28] =
           src->channel[0].arpeggio_offsets[lVar11 + -0x28];
      *(undefined2 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + -0x26) =
           *(undefined2 *)(src->channel[0].arpeggio_offsets + lVar11 + -0x26);
      *(undefined8 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + -0x24) =
           *(undefined8 *)(src->channel[0].arpeggio_offsets + lVar11 + -0x24);
      pDVar8->channel[0].arpeggio_offsets[lVar11 + -0x1c] =
           src->channel[0].arpeggio_offsets[lVar11 + -0x1c];
      pDVar8->channel[0].arpeggio_offsets[lVar11 + -0x1b] =
           src->channel[0].arpeggio_offsets[lVar11 + -0x1b];
      *(undefined8 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + -0x18) =
           *(undefined8 *)(src->channel[0].arpeggio_offsets + lVar11 + -0x18);
      pDVar8->channel[0].arpeggio_offsets[lVar11 + -0x10] =
           src->channel[0].arpeggio_offsets[lVar11 + -0x10];
      *(undefined8 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + -8) =
           *(undefined8 *)(src->channel[0].arpeggio_offsets + lVar11 + -8);
      *(undefined2 *)(pDVar8->channel[0].arpeggio_offsets + lVar11) =
           *(undefined2 *)(src->channel[0].arpeggio_offsets + lVar11);
      pDVar8->channel[0].arpeggio_offsets[lVar11 + 2] = src->channel[0].arpeggio_offsets[lVar11 + 2]
      ;
      pDVar8->channel[0].arpeggio_offsets[lVar11 + 8] = src->channel[0].arpeggio_offsets[lVar11 + 8]
      ;
      pDVar8->channel[0].arpeggio_offsets[lVar11 + 9] = src->channel[0].arpeggio_offsets[lVar11 + 9]
      ;
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0xc) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + 0xc);
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x11) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x11);
      *(undefined8 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x18) =
           *(undefined8 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x18);
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x20) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x20);
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x24) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x24);
      pDVar8->channel[0].arpeggio_offsets[lVar11 + 0x28] =
           src->channel[0].arpeggio_offsets[lVar11 + 0x28];
      pDVar8->channel[0].arpeggio_offsets[lVar11 + 0x29] =
           src->channel[0].arpeggio_offsets[lVar11 + 0x29];
      pDVar8->channel[0].arpeggio_offsets[lVar11 + 0x2b] =
           src->channel[0].arpeggio_offsets[lVar11 + 0x2b];
      *(undefined2 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x2c) =
           *(undefined2 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x2c);
      pcVar1 = src->channel[0].arpeggio_offsets + lVar11 + 0x2e;
      uVar3 = *(undefined8 *)(pcVar1 + 8);
      pcVar2 = pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x2e;
      *(undefined8 *)pcVar2 = *(undefined8 *)pcVar1;
      *(undefined8 *)(pcVar2 + 8) = uVar3;
      pcVar1 = src->channel[0].arpeggio_offsets + lVar11 + 0x3e;
      uVar3 = *(undefined8 *)(pcVar1 + 8);
      pcVar2 = pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x3e;
      *(undefined8 *)pcVar2 = *(undefined8 *)pcVar1;
      *(undefined8 *)(pcVar2 + 8) = uVar3;
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x50) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x50);
      pIVar9 = dup_playing(*(IT_PLAYING **)(src->channel[0].arpeggio_offsets + lVar11 + 0x58),
                           (IT_CHANNEL *)(dstchannel->arpeggio_offsets + lVar11 + -0x30),
                           (IT_CHANNEL *)(srcchannel->arpeggio_offsets + lVar11 + -0x30));
      *(IT_PLAYING **)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x58) = pIVar9;
      pvVar10 = bit_array_dup(*(void **)(src->channel[0].arpeggio_offsets + lVar11 + 0x60));
      *(void **)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x60) = pvVar10;
      *(undefined4 *)(pDVar8->channel[0].arpeggio_offsets + lVar11 + 0x68) =
           *(undefined4 *)(src->channel[0].arpeggio_offsets + lVar11 + 0x68);
      lVar11 = lVar11 + 0xa0;
    } while (lVar11 != 0x2800);
    lVar11 = 0x504;
    do {
      pIVar9 = dup_playing(*(IT_PLAYING **)(src->channel[0].arpeggio_offsets + lVar11 * 8 + -0x50),
                           dstchannel,srcchannel);
      *(IT_PLAYING **)(pDVar8->channel[0].arpeggio_offsets + lVar11 * 8 + -0x50) = pIVar9;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x5c4);
    iVar5 = src->speed;
    iVar6 = src->rowcount;
    iVar7 = src->order;
    pDVar8->tick = src->tick;
    pDVar8->speed = iVar5;
    pDVar8->rowcount = iVar6;
    pDVar8->order = iVar7;
    iVar5 = src->processorder;
    iVar6 = src->processrow;
    iVar7 = src->breakrow;
    pDVar8->row = src->row;
    pDVar8->processorder = iVar5;
    pDVar8->processrow = iVar6;
    pDVar8->breakrow = iVar7;
    iVar5 = src->n_rows;
    pDVar8->restart_position = src->restart_position;
    pDVar8->n_rows = iVar5;
    pIVar4 = src->entry;
    pDVar8->entry_start = src->entry_start;
    pDVar8->entry = pIVar4;
    pDVar8->entry_end = src->entry_end;
    iVar5 = src->sub_time_left;
    pDVar8->time_left = src->time_left;
    pDVar8->sub_time_left = iVar5;
    pDVar8->ramp_style = src->ramp_style;
    pDVar8->click_remover = (DUMB_CLICK_REMOVER **)0x0;
    pDVar8->callbacks = callbacks;
    pvVar10 = bit_array_dup(src->played);
    pDVar8->played = pvVar10;
    iVar5 = src->gvz_sub_time;
    pDVar8->gvz_time = src->gvz_time;
    pDVar8->gvz_sub_time = iVar5;
    return pDVar8;
  }
  if (callbacks != (IT_CALLBACKS *)0x0) {
    free(callbacks);
  }
  return (DUMB_IT_SIGRENDERER *)0x0;
}

Assistant:

static DUMB_IT_SIGRENDERER *dup_sigrenderer(DUMB_IT_SIGRENDERER *src, int n_channels, IT_CALLBACKS *callbacks)
{
	DUMB_IT_SIGRENDERER *dst;
	int i;

	if (!src) {
		if (callbacks) free(callbacks);
		return NULL;
	}

	dst = malloc(sizeof(*dst));
	if (!dst) {
		if (callbacks) free(callbacks);
		return NULL;
	}

	dst->free_playing = NULL;
	dst->sigdata = src->sigdata;

	dst->n_channels = n_channels;

	dst->resampling_quality = src->resampling_quality;

	dst->globalvolume = src->globalvolume;
	dst->globalvolslide = src->globalvolslide;

	dst->tempo = src->tempo;
	dst->temposlide = src->temposlide;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++)
		dup_channel(&dst->channel[i], &src->channel[i]);

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
		dst->playing[i] = dup_playing(src->playing[i], dst->channel, src->channel);

	dst->tick = src->tick;
	dst->speed = src->speed;
	dst->rowcount = src->rowcount;

	dst->order = src->order;
	dst->row = src->row;
	dst->processorder = src->processorder;
	dst->processrow = src->processrow;
	dst->breakrow = src->breakrow;

	dst->restart_position = src->restart_position;

	dst->n_rows = src->n_rows;

	dst->entry_start = src->entry_start;
	dst->entry = src->entry;
	dst->entry_end = src->entry_end;

	dst->time_left = src->time_left;
	dst->sub_time_left = src->sub_time_left;

	dst->ramp_style = src->ramp_style;

	dst->click_remover = NULL;

	dst->callbacks = callbacks;

#ifdef BIT_ARRAY_BULLSHIT
	dst->played = bit_array_dup(src->played);
#endif

	dst->gvz_time = src->gvz_time;
	dst->gvz_sub_time = src->gvz_sub_time;

	//dst->max_output = src->max_output;

	return dst;
}